

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O2

FOptionMenuDescriptor * UpdateJoystickConfigMenu(IJoystickConfig *joy)

{
  TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this;
  FOptionMenuDescriptor *this_00;
  int iVar1;
  FMenuDescriptor **ppFVar2;
  FOptionMenuItem *pFVar3;
  undefined4 extraout_var;
  FOptionMenuSliderJoyScale *this_01;
  FOptionMenuSliderJoyDeadZone *this_02;
  int i_1;
  uint axis;
  uint i;
  ulong uVar4;
  FOptionMenuItem *it;
  FString local_40;
  FName local_34;
  
  local_34.Index = 0x21f;
  ppFVar2 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            CheckKey(&MenuDescriptors,&local_34);
  if ((ppFVar2 == (FMenuDescriptor **)0x0) ||
     (this_00 = (FOptionMenuDescriptor *)*ppFVar2, (this_00->super_FMenuDescriptor).mType != 1)) {
    return (FOptionMenuDescriptor *)0x0;
  }
  this = &this_00->mItems;
  for (uVar4 = 0; uVar4 < (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count
      ; uVar4 = uVar4 + 1) {
    pFVar3 = (this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array[uVar4];
    if (pFVar3 != (FOptionMenuItem *)0x0) {
      (*(pFVar3->super_FListMenuItem)._vptr_FListMenuItem[1])();
    }
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Clear
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>);
  }
  if (joy == (IJoystickConfig *)0x0) {
    FString::operator=(&this_00->mTitle,"Configure Controller");
    pFVar3 = (FOptionMenuItem *)operator_new(0x28);
    FOptionMenuItemStaticText::FOptionMenuItemStaticText
              ((FOptionMenuItemStaticText *)pFVar3,"Invalid controller specified for menu",false);
  }
  else {
    (*joy->_vptr_IJoystickConfig[2])(&local_40,joy);
    FString::Format(&this_00->mTitle,"Configure %s",local_40.Chars);
    FString::~FString(&local_40);
    SELECTED_JOYSTICK = joy;
    pFVar3 = (FOptionMenuItem *)operator_new(0x50);
    FOptionMenuSliderJoySensitivity::FOptionMenuSliderJoySensitivity
              ((FOptionMenuSliderJoySensitivity *)pFVar3,"Overall sensitivity",0.0,2.0,0.1,3);
    it = pFVar3;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
    pFVar3 = (FOptionMenuItem *)operator_new(0x28);
    FOptionMenuItemStaticText::FOptionMenuItemStaticText
              ((FOptionMenuItemStaticText *)pFVar3," ",false);
    it = pFVar3;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
    iVar1 = (*joy->_vptr_IJoystickConfig[5])(joy);
    pFVar3 = (FOptionMenuItem *)operator_new(0x28);
    if (0 < iVar1) {
      FOptionMenuItemStaticText::FOptionMenuItemStaticText
                ((FOptionMenuItemStaticText *)pFVar3,"Axis Configuration",true);
      it = pFVar3;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
      for (axis = 0; iVar1 = (*joy->_vptr_IJoystickConfig[5])(joy), (int)axis < iVar1;
          axis = axis + 1) {
        pFVar3 = (FOptionMenuItem *)operator_new(0x28);
        FOptionMenuItemStaticText::FOptionMenuItemStaticText
                  ((FOptionMenuItemStaticText *)pFVar3," ",false);
        it = pFVar3;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
        pFVar3 = (FOptionMenuItem *)operator_new(0x38);
        iVar1 = (*joy->_vptr_IJoystickConfig[8])(joy,(ulong)axis);
        FOptionMenuItemJoyMap::FOptionMenuItemJoyMap
                  ((FOptionMenuItemJoyMap *)pFVar3,(char *)CONCAT44(extraout_var,iVar1),axis,
                   "JoyAxisMapNames",0);
        it = pFVar3;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
        this_01 = (FOptionMenuSliderJoyScale *)operator_new(0x58);
        FOptionMenuSliderJoyScale::FOptionMenuSliderJoyScale
                  (this_01,"Overall sensitivity",axis,0.0,4.0,0.1,3);
        it = (FOptionMenuItem *)this_01;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
        pFVar3 = (FOptionMenuItem *)operator_new(0x38);
        FOptionMenuItemInverter::FOptionMenuItemInverter
                  ((FOptionMenuItemInverter *)pFVar3,"Invert",axis,0);
        it = pFVar3;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
        this_02 = (FOptionMenuSliderJoyDeadZone *)operator_new(0x58);
        FOptionMenuSliderJoyDeadZone::FOptionMenuSliderJoyDeadZone
                  (this_02,"Dead Zone",axis,0.0,0.9,0.05,3);
        it = (FOptionMenuItem *)this_02;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
      }
      goto LAB_0032b693;
    }
    FOptionMenuItemStaticText::FOptionMenuItemStaticText
              ((FOptionMenuItemStaticText *)pFVar3,"No configurable axes",false);
  }
  it = pFVar3;
  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,&it);
LAB_0032b693:
  this_00->mScrollPos = 0;
  this_00->mIndent = 0;
  this_00->mSelectedItem = -1;
  this_00->mPosition = -0x19;
  FOptionMenuDescriptor::CalcIndent(this_00);
  return this_00;
}

Assistant:

FOptionMenuDescriptor *UpdateJoystickConfigMenu(IJoystickConfig *joy)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_JoystickConfigMenu);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		FOptionMenuDescriptor *opt = (FOptionMenuDescriptor *)*desc;
		FOptionMenuItem *it;
		for(unsigned i=0;i<opt->mItems.Size();i++)
		{
			delete opt->mItems[i];
			opt->mItems.Clear();
		}
		if (joy == NULL)
		{
			opt->mTitle = "Configure Controller";
			it = new FOptionMenuItemStaticText("Invalid controller specified for menu", false);
			opt->mItems.Push(it);
		}
		else
		{
			opt->mTitle.Format("Configure %s", joy->GetName().GetChars());

			SELECTED_JOYSTICK = joy;

			it = new FOptionMenuSliderJoySensitivity("Overall sensitivity", 0, 2, 0.1, 3);
			opt->mItems.Push(it);
			it = new FOptionMenuItemStaticText(" ", false);
			opt->mItems.Push(it);

			if (joy->GetNumAxes() > 0)
			{
				it = new FOptionMenuItemStaticText("Axis Configuration", true);
				opt->mItems.Push(it);

				for (int i = 0; i < joy->GetNumAxes(); ++i)
				{
					it = new FOptionMenuItemStaticText(" ", false);
					opt->mItems.Push(it);

					it = new FOptionMenuItemJoyMap(joy->GetAxisName(i), i, "JoyAxisMapNames", false);
					opt->mItems.Push(it);
					it = new FOptionMenuSliderJoyScale("Overall sensitivity", i, 0, 4, 0.1, 3);
					opt->mItems.Push(it);
					it = new FOptionMenuItemInverter("Invert", i, false);
					opt->mItems.Push(it);
					it = new FOptionMenuSliderJoyDeadZone("Dead Zone", i, 0, 0.9, 0.05, 3);
					opt->mItems.Push(it);
				}
			}
			else
			{
				it = new FOptionMenuItemStaticText("No configurable axes", false);
				opt->mItems.Push(it);
			}
		}
		opt->mScrollPos = 0;
		opt->mSelectedItem = -1;
		opt->mIndent = 0;
		opt->mPosition = -25;
		opt->CalcIndent();
		return opt;
	}
	return NULL;
}